

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::StandardChars<char16_t>::StandardChars
          (StandardChars<char16_t> *this,ArenaAllocator *allocator)

{
  this->allocator = allocator;
  CaseMapper<UnifiedRegex::TrivialCaseMapper>::CaseMapper
            (&this->unicodeDataCaseMapper,allocator,UnicodeData,
             (TrivialCaseMapper *)&TrivialCaseMapper::Instance);
  CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::CaseMapper
            (&this->caseFoldingCaseMapper,allocator,CaseFolding,&this->unicodeDataCaseMapper);
  this->wordSet = (CharSet<char16_t> *)0x0;
  this->nonWordSet = (CharSet<char16_t> *)0x0;
  this->fullSet = (CharSet<char16_t> *)0x0;
  this->emptySet = (CharSet<char16_t> *)0x0;
  this->newlineSet = (CharSet<char16_t> *)0x0;
  this->whitespaceSet = (CharSet<char16_t> *)0x0;
  return;
}

Assistant:

StandardChars<char16>::StandardChars(ArenaAllocator* allocator)
        : allocator(allocator)
        , unicodeDataCaseMapper(allocator, CaseInsensitive::MappingSource::UnicodeData, &TrivialCaseMapper::Instance)
        , caseFoldingCaseMapper(allocator, CaseInsensitive::MappingSource::CaseFolding, &unicodeDataCaseMapper)
        , fullSet(0)
        , emptySet(0)
        , wordSet(0)
        , nonWordSet(0)
        , newlineSet(0)
        , whitespaceSet(0)
    {
    }